

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

wchar_t archive_acl_from_text_nl
                  (archive_acl *acl,char *text,size_t length,wchar_t want_type,
                  archive_string_conv *sc)

{
  byte *pbVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  ulong uVar11;
  byte *pbVar12;
  ulong uVar13;
  ulong uVar14;
  archive_acl_entry *paVar15;
  int *piVar16;
  undefined4 uVar17;
  byte bVar18;
  byte *pbVar19;
  byte *pbVar20;
  long lVar21;
  wchar_t wVar22;
  wchar_t wVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  size_t sVar26;
  bool bVar27;
  anon_struct_16_2_267fbce2 field [6];
  wchar_t local_100;
  wchar_t local_fc;
  undefined8 local_f8;
  wchar_t local_f0;
  wchar_t local_ec;
  byte *local_e8;
  byte *local_e0;
  wchar_t local_d4;
  uint local_d0;
  wchar_t local_cc;
  ulong local_c8;
  ulong local_c0;
  undefined8 local_b8;
  archive_acl *local_b0;
  archive_string_conv *local_a8;
  long local_a0;
  long *local_98;
  long local_90;
  byte *local_88 [5];
  long alStack_60 [6];
  
  local_d0 = 5;
  if (want_type < L'̀') {
    if ((want_type != L'Ā') && (want_type != L'Ȁ')) {
      return L'\xffffffe2';
    }
  }
  else if (want_type == L'㰀') {
    local_d0 = 6;
  }
  else {
    if (want_type != L'̀') {
      return L'\xffffffe2';
    }
    want_type = L'Ā';
  }
  wVar10 = L'\0';
  local_c8 = 0;
  local_b0 = acl;
  local_a8 = sc;
  if (length == 0 || text == (char *)0x0) {
LAB_00115b42:
    archive_acl_reset(local_b0,(wchar_t)local_c8);
    return wVar10;
  }
  uVar14 = (ulong)local_d0;
  local_a0 = uVar14 + 0xfffffffe;
  local_c8 = 0;
  wVar10 = L'\0';
  local_ec = want_type;
  local_c0 = uVar14;
LAB_0011501a:
  if (*text != 0) {
    uVar13 = 0;
    pbVar12 = (byte *)text;
    do {
      uVar11 = uVar13;
      sVar26 = length;
      if (length != 0) {
        pbVar19 = pbVar12 + length;
        do {
          sVar26 = length;
          if ((0x20 < (ulong)*pbVar12) || ((0x100000600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0))
          goto LAB_0011505c;
          pbVar12 = pbVar12 + 1;
          length = length - 1;
        } while (length != 0);
        pbVar12 = pbVar19;
        sVar26 = 0;
      }
LAB_0011505c:
      pbVar19 = pbVar12;
      if (sVar26 != 0) {
        pbVar20 = pbVar12 + sVar26;
        do {
          if (((ulong)*pbVar19 < 0x3b) &&
             ((0x400100900000600U >> ((ulong)*pbVar19 & 0x3f) & 1) != 0)) goto LAB_0011508c;
          pbVar19 = pbVar19 + 1;
          sVar26 = sVar26 - 1;
        } while (sVar26 != 0);
        sVar26 = 0;
        pbVar19 = pbVar20;
      }
LAB_0011508c:
      pbVar20 = pbVar19;
      if (sVar26 != 0) {
        pbVar1 = pbVar19 + sVar26;
        do {
          if (((ulong)*pbVar20 < 0x3b) &&
             ((0x400100800000400U >> ((ulong)*pbVar20 & 0x3f) & 1) != 0)) goto LAB_001150bc;
          pbVar20 = pbVar20 + 1;
          sVar26 = sVar26 - 1;
        } while (sVar26 != 0);
        sVar26 = 0;
        pbVar20 = pbVar1;
      }
LAB_001150bc:
      bVar18 = *pbVar20;
      if (bVar18 == 0x23) {
        if (sVar26 != 0) {
          pbVar1 = pbVar20 + sVar26;
          do {
            if ((*pbVar20 == 10) || (*pbVar20 == 0x2c)) goto LAB_001150eb;
            pbVar20 = pbVar20 + 1;
            sVar26 = sVar26 - 1;
          } while (sVar26 != 0);
          sVar26 = 0;
          pbVar20 = pbVar1;
        }
LAB_001150eb:
        bVar18 = *pbVar20;
      }
      length = 0;
      if (sVar26 != 0) {
        length = sVar26 - 1;
      }
      text = (char *)(pbVar20 + (sVar26 != 0));
      if (uVar11 < uVar14) {
        (&local_98)[uVar11 * 2] = (long *)pbVar12;
        (&local_90)[uVar11 * 2] = (long)pbVar19;
      }
      uVar13 = uVar11 + 1;
      pbVar12 = (byte *)text;
    } while (bVar18 == 0x3a);
    wVar22 = (wchar_t)uVar11;
    local_cc = wVar10;
    if ((uint)(uVar11 + 1) < local_d0) {
      memset(local_88 + uVar11 * 2,0,(ulong)(uint)((int)local_a0 - wVar22) * 0x10 + 0x10);
      uVar14 = local_c0;
      want_type = local_ec;
    }
    if ((local_98 != (long *)0x0) && (wVar10 = local_cc, (char)*local_98 == '#')) goto LAB_00115b32;
    local_fc = L'\0';
    if (want_type != L'㰀') {
      local_f8 = 0;
      local_100 = want_type;
      if (((char)*local_98 == 'd') &&
         ((uVar13 = local_90 - (long)local_98, uVar13 == 1 ||
          ((6 < uVar13 &&
           (*(short *)((long)local_98 + 5) == 0x746c && *(int *)((long)local_98 + 1) == 0x75616665))
          )))) {
        if (uVar13 < 8) {
          local_100 = L'Ȁ';
          local_f8 = 1;
        }
        else {
          local_100 = L'Ȁ';
          local_98 = (long *)((long)local_98 + 7);
        }
      }
      iVar8 = (int)local_f8;
      local_d4 = iVar8 + L'\x01';
      local_e8 = *(byte **)((long)&local_98 + (ulong)(uint)(local_d4 * 0x10));
      local_e0 = *(byte **)((long)&local_90 + (ulong)(uint)(local_d4 * 0x10));
      if (local_e8 < local_e0) {
        pbVar12 = local_e8;
        wVar10 = L'\0';
        do {
          bVar18 = *pbVar12;
          if ((byte)(bVar18 - 0x3a) < 0xf6) goto LAB_001152a5;
          wVar9 = L'\x7fffffff';
          if ((wVar10 < L'\x0ccccccd') && ((wVar10 != L'\x0ccccccc' || ((char)bVar18 < '8')))) {
            wVar9 = (uint)bVar18 + wVar10 * 10 + L'\xffffffd0';
          }
          pbVar12 = pbVar12 + 1;
          wVar10 = wVar9;
        } while (pbVar12 != local_e0);
      }
      else {
LAB_001152a5:
        wVar9 = L'\xffffffff';
      }
      wVar10 = wVar9;
      if ((wVar9 == L'\xffffffff') && ((uint)(iVar8 + L'\x03') <= (uint)wVar22)) {
        uVar13 = (ulong)(uint)((iVar8 + L'\x03') * 0x10);
        pbVar12 = *(byte **)((long)&local_98 + uVar13);
        pbVar19 = *(byte **)((long)&local_90 + uVar13);
        if (pbVar12 < pbVar19) {
          wVar23 = L'\0';
          do {
            bVar18 = *pbVar12;
            wVar10 = wVar9;
            if ((byte)(bVar18 - 0x3a) < 0xf6) break;
            if (wVar23 < L'\x0ccccccd') {
              if ((wVar23 != L'\x0ccccccc') || (wVar10 = L'\x7fffffff', (char)bVar18 < '8')) {
                wVar10 = (uint)bVar18 + wVar23 * 10 + L'\xffffffd0';
              }
            }
            else {
              wVar10 = L'\x7fffffff';
            }
            wVar23 = wVar10;
            pbVar12 = pbVar12 + 1;
            wVar10 = wVar23;
          } while (pbVar12 != pbVar19);
        }
      }
      pcVar2 = *(char **)((long)&local_98 + (ulong)(uint)(iVar8 << 4));
      pcVar3 = *(char **)((long)&local_90 + (ulong)(uint)(iVar8 << 4));
      lVar21 = (long)pcVar3 - (long)pcVar2;
      if (pcVar3 == pcVar2) goto LAB_001159db;
      uVar25 = 0x2713;
      switch((int)*pcVar2 - 0x67U >> 1 | (uint)(((int)*pcVar2 - 0x67U & 1) != 0) << 0x1f) {
      case 0:
        uVar24 = 0;
        if ((lVar21 == 1) || ((lVar21 == 5 && (*(int *)(pcVar2 + 1) == 0x70756f72)))) {
          uVar24 = 0x2714;
        }
        break;
      default:
        uVar24 = 0;
        break;
      case 3:
        uVar24 = 0;
        if ((lVar21 == 1) ||
           ((lVar21 == 4 && (pcVar2[3] == 'k' && *(short *)(pcVar2 + 1) == 0x7361)))) {
          uVar24 = 0x2715;
        }
        break;
      case 4:
        uVar24 = 0;
        if ((lVar21 == 1) || ((lVar21 == 5 && (*(int *)(pcVar2 + 1) == 0x72656874)))) {
          uVar24 = 0x2716;
        }
        break;
      case 7:
        uVar24 = 0;
        if ((lVar21 == 1) ||
           ((lVar21 == 4 && (pcVar2[3] == 'r' && *(short *)(pcVar2 + 1) == 0x6573)))) {
          uVar24 = 0x2712;
          uVar25 = 0x2711;
        }
      }
      iVar8 = (int)uVar24;
      if (1 < iVar8 - 0x2715U) {
        if ((iVar8 == 0x2712) || (iVar8 == 0x2714)) {
          iVar8 = 0;
          local_f0 = wVar10;
          if ((local_e0 <= local_e8) && (wVar10 == L'\xffffffff')) {
            local_e0 = (byte *)0x0;
            local_e8 = (byte *)0x0;
            uVar25 = uVar24;
          }
          goto LAB_00115956;
        }
        goto LAB_001159db;
      }
      local_f0 = wVar10;
      local_b8 = uVar24;
      if ((local_d4 == wVar22 && local_e8 < local_e0) &&
         (wVar10 = ismode((char *)local_e8,(char *)local_e0,&local_fc), uVar14 = local_c0,
         want_type = local_ec, wVar10 != L'\0')) {
        iVar8 = -1;
        local_e0 = (byte *)0x0;
        local_e8 = (byte *)0x0;
        uVar25 = local_b8;
LAB_00115956:
        wVar10 = (wchar_t)uVar25;
      }
      else {
        if (((int)local_f8 + L'\x02' == wVar22) && (wVar10 = L'\xffffffec', local_e8 < local_e0))
        goto LAB_00115b32;
        local_e0 = (byte *)0x0;
        local_e8 = (byte *)0x0;
        iVar8 = 0;
        wVar10 = (wchar_t)local_b8;
      }
      wVar22 = local_f0;
      if (local_fc == L'\0') {
        uVar14 = (ulong)(iVar8 + (int)local_f8 + 2);
        local_f8 = CONCAT44(local_f8._4_4_,wVar10);
        wVar9 = ismode((char *)(&local_98)[uVar14 * 2],(char *)(&local_90)[uVar14 * 2],&local_fc);
        uVar14 = local_c0;
        want_type = local_ec;
        wVar10 = (wchar_t)local_f8;
        wVar22 = local_f0;
        if (wVar9 == L'\0') goto LAB_001159db;
      }
      goto LAB_00115a4d;
    }
    bVar18 = 0;
    bVar27 = true;
    uVar7 = local_f8._4_4_;
    switch(local_90 - (long)local_98) {
    case 4:
      bVar18 = 0;
      bVar6 = 0;
      local_f8 = local_f8 & 0xffffffff00000000;
      if ((int)*local_98 == 0x72657375) {
        local_f8 = CONCAT44(uVar7,0x2711);
        bVar18 = 1;
        bVar27 = false;
        goto LAB_00115441;
      }
      break;
    case 5:
      bVar18 = 0;
      bVar6 = 0;
      local_f8 = (ulong)local_f8._4_4_ << 0x20;
      if (*(char *)((long)local_98 + 4) == 'p' && (int)*local_98 == 0x756f7267) {
        local_f8 = CONCAT44(uVar7,0x2713);
        bVar6 = 1;
        bVar27 = false;
        bVar18 = 0;
      }
      break;
    case 6:
      bVar27 = false;
      if (*(short *)((long)local_98 + 4) == 0x4072 && (int)*local_98 == 0x656e776f) {
        local_f8 = CONCAT44(local_f8._4_4_,0x2712);
        bVar18 = 0;
      }
      else {
        bVar4 = *(short *)((long)local_98 + 4) != 0x4070;
        bVar5 = (int)*local_98 != 0x756f7267;
        bVar27 = bVar4 || bVar5;
        uVar17 = 0x2714;
        if (bVar4 || bVar5) {
          uVar17 = 0;
        }
        local_f8 = CONCAT44(local_f8._4_4_,uVar17);
        bVar18 = 0;
      }
LAB_00115441:
      bVar6 = 0;
      break;
    case 7:
    case 8:
      local_f8 = (ulong)local_f8._4_4_ << 0x20;
      goto LAB_0011541f;
    case 9:
      bVar4 = (char)local_98[1] != '@';
      bVar27 = bVar4 || *local_98 != 0x656e6f7972657665;
      uVar17 = 0x277b;
      if (bVar4 || *local_98 != 0x656e6f7972657665) {
        uVar17 = 0;
      }
      local_f8 = CONCAT44(local_f8._4_4_,uVar17);
LAB_0011541f:
      bVar6 = 0;
      bVar18 = 0;
      break;
    default:
      bVar6 = 0;
      local_f8 = (ulong)local_f8._4_4_ << 0x20;
    }
    wVar10 = L'\xffffffec';
    if (!bVar27) {
      local_f0 = L'\xffffffff';
      wVar10 = local_f0;
      if ((bool)(bVar18 | bVar6)) {
        iVar8 = 1;
        local_e8 = local_88[0];
        pbVar12 = local_88[1];
        if (local_88[0] < local_88[1]) {
          wVar22 = L'\0';
          pbVar19 = local_88[0];
          do {
            bVar18 = *pbVar19;
            wVar10 = local_f0;
            if ((byte)(bVar18 - 0x3a) < 0xf6) break;
            wVar10 = L'\x7fffffff';
            if ((wVar22 < L'\x0ccccccd') && ((wVar22 != L'\x0ccccccc' || ((char)bVar18 < '8')))) {
              wVar10 = (uint)bVar18 + wVar22 * 10 + L'\xffffffd0';
            }
            wVar22 = wVar10;
            pbVar19 = pbVar19 + 1;
            wVar10 = wVar22;
          } while (pbVar19 != local_88[1]);
        }
      }
      else {
        local_e8 = (byte *)0x0;
        iVar8 = 0;
        pbVar12 = (byte *)0x0;
      }
      local_f0 = wVar10;
      uVar13 = (ulong)(uint)(iVar8 << 4);
      pbVar19 = *(byte **)((long)local_88 + uVar13);
      pbVar20 = *(byte **)((long)local_88 + uVar13 + 8);
      if (pbVar19 < pbVar20) {
        local_fc = L'\0';
        do {
          bVar18 = *pbVar19;
          if (bVar18 < 99) {
            if (bVar18 < 0x44) {
              if (bVar18 != 0x2d) {
                if (bVar18 == 0x41) {
                  local_fc = local_fc | 0x400;
                }
                else {
                  if (bVar18 != 0x43) goto switchD_00115544_caseD_71;
                  local_fc = local_fc | 0x2000;
                }
              }
            }
            else if (bVar18 < 0x57) {
              if (bVar18 == 0x44) {
                local_fc = local_fc | 0x100;
              }
              else {
                if (bVar18 != 0x52) goto switchD_00115544_caseD_71;
                local_fc = local_fc | 0x40;
              }
            }
            else if (bVar18 == 0x57) {
              local_fc = local_fc | 0x80;
            }
            else {
              if (bVar18 != 0x61) goto switchD_00115544_caseD_71;
              local_fc = local_fc | 0x200;
            }
          }
          else {
            switch(bVar18) {
            case 0x6f:
              local_fc = local_fc | 0x4000;
              break;
            case 0x70:
              local_fc = local_fc | 0x20;
              break;
            case 0x71:
            case 0x74:
            case 0x75:
            case 0x76:
              goto switchD_00115544_caseD_71;
            case 0x72:
              local_fc = local_fc | 8;
              break;
            case 0x73:
              local_fc = local_fc | 0x8000;
              break;
            case 0x77:
              local_fc = local_fc | 0x10;
              break;
            case 0x78:
              local_fc = local_fc | 1;
              break;
            default:
              if (bVar18 == 99) {
                local_fc = local_fc | 0x1000;
              }
              else {
                if (bVar18 != 100) goto switchD_00115544_caseD_71;
                local_fc = local_fc | 0x800;
              }
            }
          }
          pbVar19 = pbVar19 + 1;
        } while (pbVar19 != pbVar20);
      }
      pbVar19 = *(byte **)((long)local_88 + uVar13 + 0x10);
      pbVar20 = *(byte **)((long)local_88 + uVar13 + 0x18);
      if (pbVar19 < pbVar20) {
        do {
          bVar18 = *pbVar19;
          if (bVar18 < 100) {
            if (bVar18 < 0x49) {
              if (bVar18 != 0x2d) {
                if (bVar18 != 0x46) goto switchD_00115544_caseD_71;
                local_fc = local_fc | 0x40000000;
              }
            }
            else if (bVar18 == 0x49) {
              local_fc = local_fc | 0x1000000;
            }
            else {
              if (bVar18 != 0x53) goto switchD_00115544_caseD_71;
              local_fc = local_fc | 0x20000000;
            }
          }
          else if (bVar18 < 0x69) {
            if (bVar18 == 100) {
              local_fc = local_fc | 0x4000000;
            }
            else {
              if (bVar18 != 0x66) goto switchD_00115544_caseD_71;
              local_fc = local_fc | 0x2000000;
            }
          }
          else if (bVar18 == 0x69) {
            local_fc = local_fc | 0x10000000;
          }
          else {
            if (bVar18 != 0x6e) goto switchD_00115544_caseD_71;
            local_fc = local_fc | 0x8000000;
          }
          pbVar19 = pbVar19 + 1;
        } while (pbVar19 != pbVar20);
      }
      piVar16 = *(int **)((long)local_88 + uVar13 + 0x20);
      lVar21 = *(long *)((long)alStack_60 + uVar13) - (long)piVar16;
      if (lVar21 == 5) {
        if ((char)piVar16[1] == 'w' && *piVar16 == 0x6f6c6c61) {
          local_100 = L'Ѐ';
        }
        else {
          if ((char)piVar16[1] != 't' || *piVar16 != 0x69647561) {
            bVar4 = (char)piVar16[1] == 'm';
            bVar27 = !bVar4 || *piVar16 != 0x72616c61;
            local_100 = (uint)(bVar4 && *piVar16 == 0x72616c61) << 0xd;
            goto LAB_001159d4;
          }
          local_100 = L'က';
        }
        bVar27 = false;
      }
      else {
        local_100 = L'\0';
        if (lVar21 == 4) {
          bVar27 = *piVar16 != 0x796e6564;
          local_100 = (uint)(*piVar16 == 0x796e6564) << 0xb;
        }
        else {
          bVar27 = true;
        }
      }
LAB_001159d4:
      if (!bVar27) {
        pbVar19 = *(byte **)((long)alStack_60 + uVar13 + 8);
        pbVar20 = *(byte **)((long)alStack_60 + uVar13 + 0x10);
        wVar10 = (wchar_t)local_f8;
        wVar22 = local_f0;
        local_e0 = pbVar12;
        if (pbVar19 < pbVar20) {
          wVar9 = L'\0';
          do {
            bVar18 = *pbVar19;
            wVar22 = local_f0;
            if ((byte)(bVar18 - 0x3a) < 0xf6) break;
            wVar22 = L'\x7fffffff';
            if ((wVar9 < L'\x0ccccccd') && ((wVar9 != L'\x0ccccccc' || ((char)bVar18 < '8')))) {
              wVar22 = (uint)bVar18 + wVar9 * 10 + L'\xffffffd0';
            }
            wVar9 = wVar22;
            pbVar19 = pbVar19 + 1;
            wVar22 = wVar9;
          } while (pbVar19 != pbVar20);
        }
LAB_00115a4d:
        local_f0 = wVar22;
        local_f8 = CONCAT44(local_f8._4_4_,wVar10);
        local_d4 = local_fc;
        wVar10 = acl_special(local_b0,local_100,local_fc,wVar10);
        if (wVar10 == L'\0') {
          wVar22 = L'\0';
        }
        else {
          paVar15 = acl_new_entry(local_b0,local_100,local_d4,(wchar_t)local_f8,local_f0);
          if (paVar15 == (archive_acl_entry *)0x0) {
            wVar22 = L'\xffffffe7';
          }
          else if (((local_e8 == (byte *)0x0) || (local_e0 == local_e8)) || (*local_e8 == 0)) {
            archive_mstring_clean(&paVar15->name);
            wVar22 = L'\0';
          }
          else {
            wVar10 = archive_mstring_copy_mbs_len_l
                               (&paVar15->name,(char *)local_e8,(long)local_e0 - (long)local_e8,
                                local_a8);
            wVar22 = L'\0';
            if (wVar10 != L'\0') {
              piVar16 = __errno_location();
              wVar22 = L'\xffffffec';
              if (*piVar16 == 0xc) {
                wVar22 = L'\xffffffe2';
              }
            }
          }
        }
        if (wVar22 < L'\xffffffec') {
          return wVar22;
        }
        wVar10 = local_cc;
        if (wVar22 != L'\0') {
          wVar10 = L'\xffffffec';
        }
        local_c8 = (ulong)(uint)((uint)local_c8 | local_100);
        uVar14 = local_c0;
        want_type = local_ec;
        goto LAB_00115b32;
      }
      goto LAB_001159db;
    }
    goto LAB_00115b32;
  }
  goto LAB_00115b42;
switchD_00115544_caseD_71:
LAB_001159db:
  wVar10 = L'\xffffffec';
LAB_00115b32:
  if (sVar26 < 2) goto LAB_00115b42;
  goto LAB_0011501a;
}

Assistant:

int
archive_acl_from_text_nl(struct archive_acl *acl, const char *text,
    size_t length, int want_type, struct archive_string_conv *sc)
{
	struct {
		const char *start;
		const char *end;
	} field[6], name;

	const char *s, *st;
	int numfields, fields, n, r, sol, ret;
	int type, types, tag, permset, id;
	size_t len;
	char sep;

	switch (want_type) {
	case ARCHIVE_ENTRY_ACL_TYPE_POSIX1E:
		want_type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
		__LA_FALLTHROUGH;
	case ARCHIVE_ENTRY_ACL_TYPE_ACCESS:
	case ARCHIVE_ENTRY_ACL_TYPE_DEFAULT:
		numfields = 5;
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_NFS4:
		numfields = 6;
		break;
	default:
		return (ARCHIVE_FATAL);
	}

	ret = ARCHIVE_OK;
	types = 0;

	while (text != NULL && length > 0 && *text != '\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const char *start, *end;
			next_field(&text, &length, &start, &end, &sep);
			if (fields < numfields) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == ':');

		/* Set remaining fields to blank. */
		for (n = fields; n < numfields; ++n)
			field[n].start = field[n].end = NULL;

		if (field[0].start != NULL && *(field[0].start) == '#') {
			/* Comment, skip entry */
			continue;
		}

		n = 0;
		sol = 0;
		id = -1;
		permset = 0;
		name.start = name.end = NULL;

		if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* POSIX.1e ACLs */
			/*
			 * Default keyword "default:user::rwx"
			 * if found, we have one more field
			 *
			 * We also support old Solaris extension:
			 * "defaultuser::rwx" is the default ACL corresponding
			 * to "user::rwx", etc. valid only for first field
			 */
			s = field[0].start;
			len = field[0].end - field[0].start;
			if (*s == 'd' && (len == 1 || (len >= 7
			    && memcmp((s + 1), "efault", 6) == 0))) {
				type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
				if (len > 7)
					field[0].start += 7;
				else
					n = 1;
			} else
				type = want_type;

			/* Check for a numeric ID in field n+1 or n+3. */
			isint(field[n + 1].start, field[n + 1].end, &id);
			/* Field n+3 is optional. */
			if (id == -1 && fields > (n + 3))
				isint(field[n + 3].start, field[n + 3].end,
				    &id);

			tag = 0;
			s = field[n].start;
			st = field[n].start + 1;
			len = field[n].end - field[n].start;

			if (len == 0) {
				ret = ARCHIVE_WARN;
				continue;
			}

			switch (*s) {
			case 'u':
				if (len == 1 || (len == 4
				    && memcmp(st, "ser", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				break;
			case 'g':
				if (len == 1 || (len == 5
				    && memcmp(st, "roup", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 'o':
				if (len == 1 || (len == 5
				    && memcmp(st, "ther", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_OTHER;
				break;
			case 'm':
				if (len == 1 || (len == 4
				    && memcmp(st, "ask", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_MASK;
				break;
			default:
					break;
			}

			switch (tag) {
			case ARCHIVE_ENTRY_ACL_OTHER:
			case ARCHIVE_ENTRY_ACL_MASK:
				if (fields == (n + 2)
				    && field[n + 1].start < field[n + 1].end
				    && ismode(field[n + 1].start,
				    field[n + 1].end, &permset)) {
					/* This is Solaris-style "other:rwx" */
					sol = 1;
				} else if (fields == (n + 3) &&
				    field[n + 1].start < field[n + 1].end) {
					/* Invalid mask or other field */
					ret = ARCHIVE_WARN;
					continue;
				}
				break;
			case ARCHIVE_ENTRY_ACL_USER_OBJ:
			case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
				if (id != -1 ||
				    field[n + 1].start < field[n + 1].end) {
					name = field[n + 1];
					if (tag == ARCHIVE_ENTRY_ACL_USER_OBJ)
						tag = ARCHIVE_ENTRY_ACL_USER;
					else
						tag = ARCHIVE_ENTRY_ACL_GROUP;
				}
				break;
			default:
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}

			/*
			 * Without "default:" we expect mode in field 3
			 * Exception: Solaris other and mask fields
			 */
			if (permset == 0 && !ismode(field[n + 2 - sol].start,
			    field[n + 2 - sol].end, &permset)) {
				/* Invalid mode, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
		} else {
			/* NFS4 ACLs */
			s = field[0].start;
			len = field[0].end - field[0].start;
			tag = 0;

			switch (len) {
			case 4:
				if (memcmp(s, "user", 4) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER;
				break;
			case 5:
				if (memcmp(s, "group", 5) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP;
				break;
			case 6:
				if (memcmp(s, "owner@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				else if (memcmp(s, "group@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 9:
				if (memcmp(s, "everyone@", 9) == 0)
					tag = ARCHIVE_ENTRY_ACL_EVERYONE;
				break;
			default:
				break;
			}

			if (tag == 0) {
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			} else if (tag == ARCHIVE_ENTRY_ACL_USER ||
			    tag == ARCHIVE_ENTRY_ACL_GROUP) {
				n = 1;
				name = field[1];
				isint(name.start, name.end, &id);
			} else
				n = 0;

			if (!is_nfs4_perms(field[1 + n].start,
			    field[1 + n].end, &permset)) {
				/* Invalid NFSv4 perms, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			if (!is_nfs4_flags(field[2 + n].start,
			    field[2 + n].end, &permset)) {
				/* Invalid NFSv4 flags, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			s = field[3 + n].start;
			len = field[3 + n].end - field[3 + n].start;
			type = 0;
			if (len == 4) {
				if (memcmp(s, "deny", 4) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_DENY;
			} else if (len == 5) {
				if (memcmp(s, "allow", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALLOW;
				else if (memcmp(s, "audit", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_AUDIT;
				else if (memcmp(s, "alarm", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALARM;
			}
			if (type == 0) {
				/* Invalid entry type, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			isint(field[4 + n].start, field[4 + n].end,
			    &id);
		}

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_len_l(acl, type, permset,
		    tag, id, name.start, name.end - name.start, sc);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
		types |= type;
	}

	/* Reset ACL */
	archive_acl_reset(acl, types);

	return (ret);
}